

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mycanvas.c
# Opt level: O0

void * my_canvas_new(t_symbol *s,int argc,t_atom *argv)

{
  int iVar1;
  t_iemgui *iemgui;
  _glist *p_Var2;
  t_symbol *ptVar3;
  t_float tVar4;
  int local_ec;
  char local_d8 [8];
  char str [80];
  undefined1 local_80 [8];
  t_iemgui_drawfunctions w_1;
  int fs;
  int i;
  int f;
  int ldy;
  int ldx;
  int h;
  int w;
  int a;
  t_my_canvas *x;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  
  iemgui = iemgui_new(my_canvas_class);
  p_Var2 = canvas_getcurrent();
  iVar1 = sys_zoomfontheight(p_Var2->gl_font,1,0);
  h = iVar1 + 5;
  p_Var2 = canvas_getcurrent();
  iVar1 = sys_zoomfontheight(p_Var2->gl_font,1,0);
  ldx = (int)((double)((iVar1 + 5) * 100) / 15.0);
  p_Var2 = canvas_getcurrent();
  iVar1 = sys_zoomfontheight(p_Var2->gl_font,1,0);
  ldy = (int)((double)((iVar1 + 5) * 0x3c) / 15.0);
  f = 0x14;
  i = 0xc;
  w_1.draw_move._4_4_ = 0;
  w_1.draw_move._0_4_ = iemgui->x_fontsize;
  local_80 = (undefined1  [8])my_canvas_draw_new;
  w_1.draw_new = my_canvas_draw_config;
  w_1.draw_config = my_canvas_draw_io;
  w_1.draw_iolets = (t_iemfunptr)0x0;
  w_1.draw_update = my_canvas_draw_select;
  w_1.draw_select = (t_iemdrawfunptr)0x0;
  w_1.draw_erase = (t_iemdrawfunptr)0x0;
  iemgui_setdrawfunctions(iemgui,(t_iemgui_drawfunctions *)local_80);
  iemgui->x_bcol = 0xe0e0e0;
  iemgui->x_fcol = 0;
  iemgui->x_lcol = 0x404040;
  if ((((9 < argc) && (argc < 0xe)) && (argv->a_type == A_FLOAT)) &&
     ((argv[1].a_type == A_FLOAT && (argv[2].a_type == A_FLOAT)))) {
    tVar4 = atom_getfloatarg(0,argc,argv);
    h = (int)tVar4;
    tVar4 = atom_getfloatarg(1,argc,argv);
    ldx = (int)tVar4;
    tVar4 = atom_getfloatarg(2,argc,argv);
    ldy = (int)tVar4;
  }
  if (((argc < 0xc) || ((argv[3].a_type != A_SYMBOL && (argv[3].a_type != A_FLOAT)))) ||
     ((argv[4].a_type != A_SYMBOL && (argv[4].a_type != A_FLOAT)))) {
    if ((argc == 0xb) && ((argv[3].a_type == A_SYMBOL || (argv[3].a_type == A_FLOAT)))) {
      w_1.draw_move._4_4_ = 1;
      iemgui_new_getnames(iemgui,3,argv);
    }
    else {
      iemgui_new_getnames(iemgui,3,(t_atom *)0x0);
    }
  }
  else {
    w_1.draw_move._4_4_ = 2;
    iemgui_new_getnames(iemgui,3,argv);
  }
  if ((((9 < argc) && (argc < 0xe)) &&
      ((argv[(long)w_1.draw_move._4_4_ + 3].a_type == A_SYMBOL ||
       (argv[(long)w_1.draw_move._4_4_ + 3].a_type == A_FLOAT)))) &&
     ((((argv[(long)w_1.draw_move._4_4_ + 4].a_type == A_FLOAT &&
        (argv[(long)w_1.draw_move._4_4_ + 5].a_type == A_FLOAT)) &&
       (argv[(long)w_1.draw_move._4_4_ + 6].a_type == A_FLOAT)) &&
      (argv[(long)w_1.draw_move._4_4_ + 7].a_type == A_FLOAT)))) {
    if (argv[(long)w_1.draw_move._4_4_ + 3].a_type == A_FLOAT) {
      atom_string(argv + (long)w_1.draw_move._4_4_ + 3,local_d8,0x50);
      ptVar3 = gensym(local_d8);
      iemgui->x_lab = ptVar3;
    }
    else {
      ptVar3 = iemgui_new_dogetname(iemgui,w_1.draw_move._4_4_ + 3,argv);
      iemgui->x_lab = ptVar3;
    }
    iemgui->x_labelbindex = w_1.draw_move._4_4_ + 4;
    tVar4 = atom_getfloatarg(w_1.draw_move._4_4_ + 4,argc,argv);
    f = (int)tVar4;
    tVar4 = atom_getfloatarg(w_1.draw_move._4_4_ + 5,argc,argv);
    i = (int)tVar4;
    tVar4 = atom_getfloatarg(w_1.draw_move._4_4_ + 6,argc,argv);
    iem_inttofstyle(&iemgui->x_fsf,(int)tVar4);
    tVar4 = atom_getfloatarg(w_1.draw_move._4_4_ + 7,argc,argv);
    w_1.draw_move._0_4_ = (int)tVar4;
    iemgui->x_fontsize = (int)w_1.draw_move;
    iemgui_all_loadcolors
              (iemgui,argv + (long)w_1.draw_move._4_4_ + 8,(t_atom *)0x0,
               argv + (long)w_1.draw_move._4_4_ + 9);
  }
  if ((argc == 0xd) && (argv[(long)w_1.draw_move._4_4_ + 10].a_type == A_FLOAT)) {
    tVar4 = atom_getfloatarg(w_1.draw_move._4_4_ + 10,0xd,argv);
    iem_inttosymargs(&iemgui->x_isa,(int)tVar4);
  }
  iemgui->x_fsf =
       (t_iem_fstyle_flags)
       ((uint)iemgui->x_fsf & 0xffffff7f | (uint)(iemgui->x_snd != (t_symbol *)0x0) << 7);
  iemgui->x_fsf =
       (t_iem_fstyle_flags)
       ((uint)iemgui->x_fsf & 0xffffffbf | (uint)(iemgui->x_rcv != (t_symbol *)0x0) << 6);
  if (h < 1) {
    h = 1;
  }
  iemgui->x_w = h;
  iemgui->x_h = iemgui->x_w;
  if (ldx < 1) {
    ldx = 1;
  }
  *(int *)&iemgui[1].x_glist = ldx;
  if (ldy < 1) {
    ldy = 1;
  }
  *(int *)((long)&iemgui[1].x_glist + 4) = ldy;
  if (((uint)iemgui->x_fsf & 0x3f) == 1) {
    strcpy(iemgui->x_font,"helvetica");
  }
  else if (((uint)iemgui->x_fsf & 0x3f) == 2) {
    strcpy(iemgui->x_font,"times");
  }
  else {
    iemgui->x_fsf = (t_iem_fstyle_flags)((uint)iemgui->x_fsf & 0xffffffc0);
    strcpy(iemgui->x_font,sys_font);
  }
  if (((uint)iemgui->x_fsf >> 6 & 1) != 0) {
    pd_bind((t_pd *)iemgui,iemgui->x_rcv);
  }
  iemgui->x_ldx = f;
  iemgui->x_ldy = i;
  if ((int)w_1.draw_move < 4) {
    local_ec = 4;
  }
  else {
    local_ec = (int)w_1.draw_move;
  }
  iemgui->x_fontsize = local_ec;
  *(undefined4 *)&iemgui[1].x_obj.te_g.g_pd = 1;
  *(undefined4 *)&iemgui[1].x_obj.te_binbuf = 1;
  iemgui_verify_snd_ne_rcv(iemgui);
  iemgui_newzoom(iemgui);
  return iemgui;
}

Assistant:

static void *my_canvas_new(t_symbol *s, int argc, t_atom *argv)
{
    t_my_canvas *x = (t_my_canvas *)iemgui_new(my_canvas_class);
    int a = IEM_GUI_DEFAULTSIZE;
    int w = 100 * IEM_GUI_DEFAULTSIZE_SCALE, h = 60 * IEM_GUI_DEFAULTSIZE_SCALE;
    int ldx = 20, ldy = 12, f = 2, i = 0;
    int fs = x->x_gui.x_fontsize;

    IEMGUI_SETDRAWFUNCTIONS(x, my_canvas);

    x->x_gui.x_bcol = 0xE0E0E0;
    x->x_gui.x_fcol = 0x00;
    x->x_gui.x_lcol = 0x404040;

    if(((argc >= 10)&&(argc <= 13))
       &&IS_A_FLOAT(argv,0)&&IS_A_FLOAT(argv,1)&&IS_A_FLOAT(argv,2))
    {
        a = atom_getfloatarg(0, argc, argv);
        w = atom_getfloatarg(1, argc, argv);
        h = atom_getfloatarg(2, argc, argv);
    }
    if((argc >= 12)&&(IS_A_SYMBOL(argv,3)||IS_A_FLOAT(argv,3))&&(IS_A_SYMBOL(argv,4)||IS_A_FLOAT(argv,4)))
    {
        i = 2;
        iemgui_new_getnames(&x->x_gui, 3, argv);
    }
    else if((argc == 11)&&(IS_A_SYMBOL(argv,3)||IS_A_FLOAT(argv,3)))
    {
        i = 1;
        iemgui_new_getnames(&x->x_gui, 3, argv);
    }
    else iemgui_new_getnames(&x->x_gui, 3, 0);

    if(((argc >= 10)&&(argc <= 13))
       &&(IS_A_SYMBOL(argv,i+3)||IS_A_FLOAT(argv,i+3))&&IS_A_FLOAT(argv,i+4)
       &&IS_A_FLOAT(argv,i+5)&&IS_A_FLOAT(argv,i+6)
       &&IS_A_FLOAT(argv,i+7))
    {
            /* disastrously, the "label" sits in a different part of the
            message.  So we have to track its location separately (in
            the slot x_labelbindex) and initialize it specially here. */
        if(IS_A_FLOAT(argv, i+3))
        {
            char str[80];
            atom_string(argv+i+3, str, sizeof(str));
            x->x_gui.x_lab = gensym(str);
        } else {
            x->x_gui.x_lab = iemgui_new_dogetname(&x->x_gui, i+3, argv);
        }
        x->x_gui.x_labelbindex = i+4;
        ldx = atom_getfloatarg(i+4, argc, argv);
        ldy = atom_getfloatarg(i+5, argc, argv);
        iem_inttofstyle(&x->x_gui.x_fsf, atom_getfloatarg(i+6, argc, argv));
        fs = atom_getfloatarg(i+7, argc, argv);
        x->x_gui.x_fontsize = fs;
        iemgui_all_loadcolors(&x->x_gui, argv+i+8, 0, argv+i+9);
    }
    if((argc == 13)&&IS_A_FLOAT(argv,i+10))
    {
        iem_inttosymargs(&x->x_gui.x_isa, atom_getfloatarg(i+10, argc, argv));
    }
    x->x_gui.x_fsf.x_snd_able = (0 != x->x_gui.x_snd);
    x->x_gui.x_fsf.x_rcv_able = (0 != x->x_gui.x_rcv);
    if(a < 1)
        a = 1;
    x->x_gui.x_w = a;
    x->x_gui.x_h = x->x_gui.x_w;
    if(w < 1)
        w = 1;
    x->x_vis_w = w;
    if(h < 1)
        h = 1;
    x->x_vis_h = h;
    if(x->x_gui.x_fsf.x_font_style == 1) strcpy(x->x_gui.x_font, "helvetica");
    else if(x->x_gui.x_fsf.x_font_style == 2) strcpy(x->x_gui.x_font, "times");
    else { x->x_gui.x_fsf.x_font_style = 0;
        strcpy(x->x_gui.x_font, sys_font); }
    if (x->x_gui.x_fsf.x_rcv_able)
        pd_bind(&x->x_gui.x_obj.ob_pd, x->x_gui.x_rcv);
    x->x_gui.x_ldx = ldx;
    x->x_gui.x_ldy = ldy;
    x->x_gui.x_fontsize = (fs < 4)?4:fs;
    x->x_at[0].a_type = A_FLOAT;
    x->x_at[1].a_type = A_FLOAT;
    iemgui_verify_snd_ne_rcv(&x->x_gui);
    iemgui_newzoom(&x->x_gui);
    return (x);
}